

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1774:48)>
::destroy(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1774:48)>
          *this)

{
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1774:48)>
  *this_local;
  
  freePromise<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<unsigned_char_const>,kj::NetworkAddress&)::__1>>
            (this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }